

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

void __thiscall cplus::lang::ByteArray::setSize(ByteArray *this,size_t size)

{
  char *pcVar1;
  ulong local_40;
  ulong local_30;
  size_t index;
  size_t minSize;
  char *newBuffer;
  size_t size_local;
  ByteArray *this_local;
  
  if (size < this->bufferSize) {
    this->size = size;
  }
  else {
    pcVar1 = (char *)operator_new__(size);
    local_40 = size;
    if (this->size <= size) {
      local_40 = this->size;
    }
    for (local_30 = 0; local_30 < local_40; local_30 = local_30 + 1) {
      pcVar1[local_30] = this->buffer[local_30];
    }
    if (this->buffer != (char *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = pcVar1;
    this->bufferSize = size;
    this->size = size;
  }
  return;
}

Assistant:

void ByteArray::setSize(size_t size) {
			if (size < bufferSize) {
				this->size = size;
			} else {
				auto newBuffer = new char[size];
				auto minSize = (size < this->size) ? size : this->size;
				for (size_t index = 0; index < minSize; index++) {
					newBuffer[index] = buffer[index];
				}
				delete[] buffer;
				buffer = newBuffer;
				bufferSize = size;
				ByteArray::size = size;
			}
		}